

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_callermsg(lua_State *L,char *msg)

{
  cTValue *pcVar1;
  uint uVar2;
  TValue *pTVar3;
  cTValue *pcVar4;
  cTValue *frame;
  
  pTVar3 = L->base;
  pcVar1 = pTVar3 + -1;
  uVar2 = *(uint *)((long)pTVar3 + -4);
  pcVar4 = pcVar1;
  if (((long)(int)uVar2 & 3U) == 0) {
    frame = pcVar1 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
  }
  else if ((uVar2 & 7) == 2) {
    if (pTVar3[-2].u32.lo == 1) {
      pcVar4 = (cTValue *)0x0;
      frame = pcVar1;
    }
    else {
      frame = (cTValue *)((long)pcVar1 - ((long)(int)uVar2 & 0xfffffffffffffff8U));
      if ((byte)(*(char *)((ulong)(pcVar1->u32).lo + 6) + 0x5dU) < 0x10) {
        L->base = frame + 1;
        L->top = pcVar1;
        *(undefined4 *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x1c) =
             *(undefined4 *)((long)pTVar3 + -0xc);
      }
    }
  }
  else {
    frame = (cTValue *)0x0;
  }
  lj_debug_addloc(L,msg,frame,pcVar4);
  lj_err_run(L);
}

Assistant:

LJ_NOINLINE void lj_err_callermsg(lua_State *L, const char *msg)
{
  TValue *frame = L->base-1;
  TValue *pframe = NULL;
  if (frame_islua(frame)) {
    pframe = frame_prevl(frame);
  } else if (frame_iscont(frame)) {
    if (frame_iscont_fficb(frame)) {
      pframe = frame;
      frame = NULL;
    } else {
      pframe = frame_prevd(frame);
#if LJ_HASFFI
      /* Remove frame for FFI metamethods. */
      if (frame_func(frame)->c.ffid >= FF_ffi_meta___index &&
	  frame_func(frame)->c.ffid <= FF_ffi_meta___tostring) {
	L->base = pframe+1;
	L->top = frame;
	setcframe_pc(cframe_raw(L->cframe), frame_contpc(frame));
      }
#endif
    }
  }
  lj_debug_addloc(L, msg, pframe, frame);
  lj_err_run(L);
}